

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O3

shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> __thiscall
juzzlin::Argengine::Impl::addOption
          (Impl *this,OptionSet *optionVariants,ValuelessCallback *callback,bool required,
          string *infoText)

{
  undefined7 in_register_00000009;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> sVar2;
  _Any_data local_50;
  _Manager_type local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  std::function<void_()>::function
            ((function<void_()> *)&local_50,
             (function<void_()> *)CONCAT71(in_register_00000009,required));
  sVar2 = addOptionCommon<std::function<void()>>
                    (this,optionVariants,callback,SUB81(&local_50,0),
                     (string *)((ulong)infoText & 0xffffffff));
  _Var1 = sVar2.
          super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi;
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>)
         sVar2.
         super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<OptionDefinition> addOption(const OptionSet & optionVariants, ValuelessCallback callback, bool required, const std::string & infoText)
    {
        return addOptionCommon(optionVariants, callback, required, infoText);
    }